

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void vec_add_internal(void *v,void *elem)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  byte bVar4;
  
  uVar1 = *v;
  if ((ulong)uVar1 == 0) {
    pvVar3 = (void *)((long)v + 0x10);
  }
  else {
    if (*(void **)((long)v + 8) == (void *)((long)v + 0x10)) {
      pvVar3 = malloc(0x40);
      *(void **)((long)v + 8) = pvVar3;
      memcpy(pvVar3,(void *)((long)v + 0x10),(ulong)uVar1 << 3);
      goto LAB_0012d549;
    }
    if ((uVar1 & 7) != 0) goto LAB_0012d549;
    bVar4 = 4;
    uVar2 = uVar1 & 8;
    uVar1 = (int)uVar1 >> 3;
    while (uVar2 == 0) {
      bVar4 = bVar4 + 1;
      uVar2 = uVar1 & 2;
      uVar1 = (int)uVar1 >> 1;
    }
    if (1 < uVar1) goto LAB_0012d549;
    pvVar3 = realloc(*(void **)((long)v + 8),(long)(1 << (bVar4 & 0x1f)) << 3);
  }
  *(void **)((long)v + 8) = pvVar3;
LAB_0012d549:
  uVar1 = *v;
  *(void **)(*(long *)((long)v + 8) + (ulong)uVar1 * 8) = elem;
  *(uint *)v = uVar1 + 1;
  return;
}

Assistant:

void vec_add_internal(void *v, void *elem) {
  AbstractVec *av = (AbstractVec *)v;
  if (!av->n) {
    av->v = av->e;
  } else if (av->v == av->e) {
    av->v = (void **)MALLOC(INITIAL_VEC_SIZE * sizeof(void *));
    memcpy(av->v, av->e, av->n * sizeof(void *));
  } else {
    if ((av->n & (INITIAL_VEC_SIZE - 1)) == 0) {
      int l = av->n, nl = (1 + INITIAL_VEC_SHIFT);
      l = l >> INITIAL_VEC_SHIFT;
      while (!(l & 1)) {
        l = l >> 1;
        nl++;
      }
      l = l >> 1;
      if (!av->n || !l) {
        nl = 1 << nl;
        av->v = (void **)REALLOC(av->v, nl * sizeof(void *));
      }
    }
  }
  av->v[av->n] = elem;
  av->n++;
}